

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<(anonymous_namespace)::TreeNode>::reallocateAndGrow
          (QArrayDataPointer<(anonymous_namespace)::TreeNode> *this,GrowthPosition where,qsizetype n
          ,QArrayDataPointer<(anonymous_namespace)::TreeNode> *old)

{
  QArrayData *pQVar1;
  Data *pDVar2;
  qsizetype qVar3;
  qsizetype qVar4;
  long lVar5;
  TreeNode *pTVar6;
  Int IVar7;
  long lVar8;
  int in_register_00000034;
  ulong uVar9;
  long lVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  QArrayDataPointer<(anonymous_namespace)::TreeNode> local_50;
  QArrayData *local_38;
  long local_30;
  
  uVar9 = CONCAT44(in_register_00000034,where);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->d->super_QArrayData;
  if (pQVar1 == (QArrayData *)0x0) {
    qVar3 = 0;
  }
  else {
    if ((uVar9 != 0 && -1 < in_register_00000034) &&
       ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
      lVar10 = pQVar1->alloc;
      qVar3 = freeSpaceAtEnd(this);
      auVar11 = QArrayData::reallocateUnaligned(pQVar1,this->ptr,0x28,(uVar9 + lVar10) - qVar3,Grow)
      ;
      this->d = (Data *)auVar11._0_8_;
      this->ptr = (TreeNode *)auVar11._8_8_;
      goto LAB_003a19df;
    }
    qVar3 = pQVar1->alloc;
  }
  local_50.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_50.ptr = (TreeNode *)&DAT_aaaaaaaaaaaaaaaa;
  if (qVar3 < this->size) {
    qVar3 = this->size;
  }
  qVar4 = freeSpaceAtEnd(this);
  lVar10 = (qVar3 + uVar9) - qVar4;
  if (pQVar1 == (QArrayData *)0x0) {
    lVar5 = 0;
  }
  else {
    lVar5 = pQVar1->alloc;
    lVar8 = lVar10;
    if (lVar10 < lVar5) {
      lVar8 = lVar5;
    }
    if (((pQVar1->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) {
      lVar10 = lVar8;
    }
  }
  local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pTVar6 = (TreeNode *)QArrayData::allocate(&local_38,0x28,0x10,lVar10,(uint)(lVar10 <= lVar5));
  local_50.d = (Data *)local_38;
  if (pTVar6 != (TreeNode *)0x0 && local_38 != (QArrayData *)0x0) {
    qVar3 = freeSpaceAtBegin(this);
    if (this->d == (Data *)0x0) {
      IVar7 = 0;
    }
    else {
      IVar7 = (this->d->super_QArrayData).flags.
              super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
              super_QFlagsStorage<QArrayData::ArrayOption>.i;
    }
    pTVar6 = pTVar6 + qVar3;
    ((local_50.d)->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
    super_QFlagsStorage<QArrayData::ArrayOption>.i = IVar7;
  }
  local_50.size = 0;
  local_50.ptr = pTVar6;
  if (this->size != 0) {
    QtPrivate::QPodArrayOps<(anonymous_namespace)::TreeNode>::copyAppend
              ((QPodArrayOps<(anonymous_namespace)::TreeNode> *)&local_50,this->ptr,
               this->ptr + ((long)in_register_00000034 >> 0x1f & uVar9) + this->size);
  }
  pDVar2 = this->d;
  this->d = local_50.d;
  pTVar6 = this->ptr;
  this->ptr = local_50.ptr;
  qVar3 = this->size;
  this->size = local_50.size;
  local_50.d = pDVar2;
  local_50.ptr = pTVar6;
  local_50.size = qVar3;
  ~QArrayDataPointer(&local_50);
LAB_003a19df:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }